

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

int randrace(int rolenum)

{
  boolean bVar1;
  int iVar2;
  int local_18;
  int local_14;
  int n;
  int i;
  int rolenum_local;
  
  local_18 = 0;
  local_14 = 0;
  while (races[local_14].noun != (char *)0x0) {
    bVar1 = validrace(rolenum,local_14);
    if (bVar1 != '\0') {
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  if (local_18 != 0) {
    local_18 = rn2(local_18 * 100);
    local_18 = local_18 / 100;
  }
  local_14 = 0;
  do {
    if (races[local_14].noun == (char *)0x0) {
      iVar2 = rn2(6);
      return iVar2;
    }
    bVar1 = validrace(rolenum,local_14);
    if (bVar1 != '\0') {
      if (local_18 == 0) {
        return local_14;
      }
      local_18 = local_18 + -1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int randrace(int rolenum)
{
	int i, n = 0;

	/* Count the number of valid races */
	for (i = 0; races[i].noun; i++) {
	    if (validrace(rolenum, i))
		n++;
	}

	/* Pick a random race */
	/* Use a factor of 100 in case of bad random number generators */
	if (n) n = rn2(n*100)/100;
	for (i = 0; races[i].noun; i++) {
	    if (validrace(rolenum, i)) {
		if (n) n--;
		else return i;
	    }
	}

	/* This role has no permitted races? */
	return rn2(SIZE(races)-1);
}